

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O0

bool __thiscall
trial::protocol::buffer::basic_string<unsigned_char,_trial::protocol::buffer::base<unsigned_char>_>
::grow(basic_string<unsigned_char,_trial::protocol::buffer::base<unsigned_char>_> *this,
      size_type delta)

{
  size_type sVar1;
  ulong __res;
  size_type size;
  size_type delta_local;
  basic_string<unsigned_char,_trial::protocol::buffer::base<unsigned_char>_> *this_local;
  
  sVar1 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::size(this->content);
  __res = sVar1 + delta + 1;
  sVar1 = std::__cxx11::
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          ::capacity(this->content);
  if (sVar1 < __res) {
    sVar1 = std::__cxx11::
            basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
            ::max_size(this->content);
    if (sVar1 < __res) {
      return false;
    }
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    reserve(this->content,__res);
  }
  return true;
}

Assistant:

virtual bool grow(size_type delta)
    {
        const size_type size = content.size() + delta + 1;
        if (size > content.capacity())
        {
            if (size > content.max_size())
                return false;
            content.reserve(size);
        }
        return true;
    }